

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fib-lace.c
# Opt level: O1

int main(int argc,char **argv)

{
  Task *__dq_head;
  uint32_t *puVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Worker *pWVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Task *__dq_head_00;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  timespec tv;
  Task local_70;
  
  iVar3 = getopt(argc,argv,"w:q:h");
  iVar3 = iVar3 << 0x18;
  if (iVar3 == -0x1000000) {
    uVar5 = 1;
    __dq_head_00 = (Task *)0x186a0;
  }
  else {
    iVar4 = 100000;
    uVar5 = 1;
    do {
      iVar3 = iVar3 >> 0x18;
      if (iVar3 == 0x71) {
        iVar4 = atoi(_optarg);
      }
      else if (iVar3 == 0x77) {
        uVar5 = atoi(_optarg);
      }
      else {
        if (iVar3 != 0x68) {
          abort();
        }
        main_cold_1();
      }
      iVar3 = getopt(argc,argv,"w:q:h");
      iVar3 = iVar3 << 0x18;
    } while (iVar3 != -0x1000000);
    __dq_head_00 = (Task *)(long)iVar4;
  }
  if (_optind != argc) {
    lace_start(uVar5,(size_t)__dq_head_00);
    uVar5 = atoi(argv[_optind]);
    clock_gettime(1,(timespec *)&local_70);
    dVar10 = (double)(long)local_70.f;
    dVar12 = (double)(long)local_70.thief;
    local_70.f = pfib_WRAP;
    local_70.thief = (_Worker *)0x1;
    local_70.d._0_4_ = uVar5;
    lace_run_task(&local_70);
    uVar2 = local_70.d._0_4_;
    clock_gettime(1,(timespec *)&local_70);
    dVar11 = (double)(long)local_70.f;
    dVar13 = (double)(long)local_70.thief;
    printf("fib(%d) = %d\n",(ulong)uVar5,(ulong)(uint)uVar2);
    printf("Time: %f\n",(dVar13 * 1e-09 + dVar11) - (dVar12 * 1e-09 + dVar10));
    lace_stop();
    return 0;
  }
  main_cold_2();
  if (((WorkerP *)argv)->allstolen == '\0') {
    if (((WorkerP *)argv)->split <= __dq_head_00) {
LAB_001017cc:
      pWVar6 = ((WorkerP *)argv)->_public;
      if (pWVar6->movesplit != '\0') {
        uVar9 = ((long)__dq_head_00 - (long)((WorkerP *)argv)->split >> 6) + 1U >> 1;
        ((WorkerP *)argv)->split = ((WorkerP *)argv)->split + uVar9;
        LOCK();
        puVar1 = &(pWVar6->ts).ts.split;
        *puVar1 = *puVar1 + (int)uVar9;
        UNLOCK();
        pWVar6->movesplit = '\0';
      }
      __dq_head_00->thief = (_Worker *)0x0;
      iVar3 = pfib_CALL((WorkerP *)argv,__dq_head_00,*(int *)__dq_head_00->d);
      return iVar3;
    }
    pWVar6 = ((WorkerP *)argv)->_public;
    uVar7 = (pWVar6->ts).ts.tail;
    uVar5 = (pWVar6->ts).ts.split;
    if (uVar7 != uVar5) {
      uVar8 = uVar7 + uVar5 >> 1;
      (pWVar6->ts).ts.split = uVar8;
      uVar7 = (pWVar6->ts).ts.tail;
      if (uVar7 != uVar5) {
        if (uVar8 < uVar7) {
          uVar8 = uVar7 + uVar5 >> 1;
          (pWVar6->ts).ts.split = uVar8;
        }
        ((WorkerP *)argv)->split = ((WorkerP *)argv)->dq + uVar8;
        goto LAB_001017cc;
      }
    }
    pWVar6->allstolen = '\x01';
    ((WorkerP *)argv)->allstolen = '\x01';
  }
  pWVar6 = __dq_head_00->thief;
  if (pWVar6 != (Worker *)0x2) {
    while (pWVar6 < (Worker *)0x2) {
      pWVar6 = __dq_head_00->thief;
    }
    if (pWVar6 != (Worker *)0x2) {
      __dq_head = __dq_head_00 + 1;
      iVar3 = 0x20;
      do {
        pWVar6 = lace_steal((WorkerP *)argv,__dq_head,pWVar6);
        if (pWVar6 == (Worker *)0x2) {
          if (lace_newframe.t != (Task *)0x0) {
            lace_yield((WorkerP *)argv,__dq_head);
          }
          iVar3 = iVar3 + -1;
          if (iVar3 == 0) {
            lace_steal_random_CALL((WorkerP *)argv,__dq_head);
            iVar3 = 0x20;
          }
        }
        pWVar6 = __dq_head_00->thief;
      } while (pWVar6 != (Worker *)0x2);
    }
    if (((WorkerP *)argv)->allstolen == '\0') {
      ((WorkerP *)argv)->_public->allstolen = '\x01';
      ((WorkerP *)argv)->allstolen = '\x01';
    }
  }
  __dq_head_00->thief = (_Worker *)0x0;
  return *(int *)__dq_head_00->d;
}

Assistant:

int main(int argc, char **argv)
{
    int workers = 1;
    int dqsize = 100000;

    char c;
    while ((c=getopt(argc, argv, "w:q:h")) != -1) {
        switch (c) {
            case 'w':
                workers = atoi(optarg);
                break;
            case 'q':
                dqsize = atoi(optarg);
                break;
            case 'h':
                usage(argv[0]);
                break;
            default:
                abort();
        }
    }

    if (optind == argc) {
        usage(argv[0]);
        exit(1);
    }

    lace_start(workers, dqsize);

    int n = atoi(argv[optind]);

    double t1 = wctime();
    int m = RUN(pfib, n);
    double t2 = wctime();

    printf("fib(%d) = %d\n", n, m);
    printf("Time: %f\n", t2-t1);

    lace_stop();
    return 0;
}